

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::SPxSolverBase<double>::getRedCostSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  double dVar1;
  bool bVar2;
  Representation RVar3;
  SPxSense SVar4;
  int iVar5;
  Status SVar6;
  undefined8 uVar7;
  double *pdVar8;
  SPxSolverBase<double> *in_RDI;
  int i_1;
  Desc *ds;
  int i;
  SPxBasisBase<double> *in_stack_ffffffffffffff18;
  SPxLPBase<double> *in_stack_ffffffffffffff20;
  Status in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  VectorBase<double> *in_stack_ffffffffffffff30;
  int local_8c;
  DataKey local_7c;
  SPxColId local_74;
  DataKey local_6c;
  DataKey local_64;
  SPxColId local_5c;
  DataKey local_54;
  int local_4c;
  undefined1 local_45;
  allocator local_31;
  string local_30 [48];
  
  bVar2 = isInitialized(in_RDI);
  if (bVar2) {
    RVar3 = rep(in_RDI);
    if (RVar3 == ROW) {
      VectorBase<double>::clear(in_stack_ffffffffffffff30);
      SVar4 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
      if (SVar4 == MINIMIZE) {
        local_4c = dim((SPxSolverBase<double> *)0x24de4a);
        while (local_4c = local_4c + -1, -1 < local_4c) {
          local_54 = (DataKey)SPxBasisBase<double>::baseId(in_stack_ffffffffffffff18,0);
          bVar2 = SPxId::isSPxColId((SPxId *)&local_54);
          if (bVar2) {
            fVec(in_RDI);
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            dVar1 = *pdVar8;
            local_64 = (DataKey)SPxBasisBase<double>::baseId(in_stack_ffffffffffffff18,0);
            SPxColId::SPxColId(&local_5c,(SPxId *)&local_64);
            SPxLPBase<double>::number
                      (in_stack_ffffffffffffff20,(SPxColId *)in_stack_ffffffffffffff18);
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            *pdVar8 = -dVar1;
          }
        }
      }
      else {
        local_4c = dim((SPxSolverBase<double> *)0x24df63);
        while (local_4c = local_4c + -1, -1 < local_4c) {
          local_6c = (DataKey)SPxBasisBase<double>::baseId(in_stack_ffffffffffffff18,0);
          bVar2 = SPxId::isSPxColId((SPxId *)&local_6c);
          if (bVar2) {
            fVec(in_RDI);
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            dVar1 = *pdVar8;
            local_7c = (DataKey)SPxBasisBase<double>::baseId(in_stack_ffffffffffffff18,0);
            SPxColId::SPxColId(&local_74,(SPxId *)&local_7c);
            SPxLPBase<double>::number
                      (in_stack_ffffffffffffff20,(SPxColId *)in_stack_ffffffffffffff18);
            pdVar8 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_ffffffffffffff20,
                                (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
            *pdVar8 = dVar1;
          }
        }
      }
    }
    else {
      SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
      local_8c = 0;
      while (in_stack_ffffffffffffff2c = local_8c,
            iVar5 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x24e07b),
            in_stack_ffffffffffffff2c < iVar5) {
        in_stack_ffffffffffffff28 =
             SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_ffffffffffffff20,
                        (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        iVar5 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
        if (((((uint)(in_stack_ffffffffffffff28 + P_FREE) < 2) ||
             (in_stack_ffffffffffffff28 == D_ON_LOWER)) || (in_stack_ffffffffffffff28 == D_ON_BOTH))
           || (in_stack_ffffffffffffff28 == D_UNDEFINED)) {
          pdVar8 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar5);
          *pdVar8 = 0.0;
        }
        else {
          SPxLPBase<double>::maxObj((SPxLPBase<double> *)0x24e0ed);
          pdVar8 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,iVar5);
          in_stack_ffffffffffffff18 = (SPxBasisBase<double> *)*pdVar8;
          pdVar8 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,
                              (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          in_stack_ffffffffffffff20 =
               (SPxLPBase<double> *)((double)in_stack_ffffffffffffff18 - *pdVar8);
          pdVar8 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff20,
                              (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          *pdVar8 = (double)in_stack_ffffffffffffff20;
        }
        local_8c = local_8c + 1;
      }
      SVar4 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
      if (SVar4 == MINIMIZE) {
        VectorBase<double>::operator*=
                  (in_stack_ffffffffffffff30,
                   (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      }
    }
    SVar6 = status((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    return SVar6;
  }
  local_45 = 1;
  uVar7 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"XSOLVE09 No Problem loaded",&local_31);
  SPxStatusException::SPxStatusException
            ((SPxStatusException *)in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18);
  local_45 = 0;
  __cxa_throw(uVar7,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getRedCostSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE09 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == ROW)
   {
      int i;
      p_vector.clear();

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = -fVec()[i];
         }
      }
      else
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = fVec()[i];
         }
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = this->maxObj()[i] - (*thePvec)[i];
         }
      }

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
         p_vector *= -1.0;
   }

   return status();
}